

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

error_code ghc::filesystem::detail::make_error_code(portable_error err)

{
  error_category *peVar1;
  error_code eVar2;
  undefined1 local_18 [4];
  portable_error err_local;
  error_category *local_10;
  
  switch(err) {
  case none:
    std::error_code::error_code((error_code *)local_18);
    break;
  case exists:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code((error_code *)local_18,0x11,peVar1);
    break;
  case not_found:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code((error_code *)local_18,2,peVar1);
    break;
  case not_supported:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code((error_code *)local_18,0x5f,peVar1);
    break;
  case not_implemented:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code((error_code *)local_18,0x26,peVar1);
    break;
  case invalid_argument:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code((error_code *)local_18,0x16,peVar1);
    break;
  case is_a_directory:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code((error_code *)local_18,0x15,peVar1);
    break;
  default:
    std::error_code::error_code((error_code *)local_18);
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (int)local_18;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

GHC_INLINE std::error_code make_error_code(portable_error err)
{
#ifdef GHC_OS_WINDOWS
    switch (err) {
        case portable_error::none:
            return std::error_code();
        case portable_error::exists:
            return std::error_code(ERROR_ALREADY_EXISTS, std::system_category());
        case portable_error::not_found:
            return std::error_code(ERROR_PATH_NOT_FOUND, std::system_category());
        case portable_error::not_supported:
            return std::error_code(ERROR_NOT_SUPPORTED, std::system_category());
        case portable_error::not_implemented:
            return std::error_code(ERROR_CALL_NOT_IMPLEMENTED, std::system_category());
        case portable_error::invalid_argument:
            return std::error_code(ERROR_INVALID_PARAMETER, std::system_category());
        case portable_error::is_a_directory:
#ifdef ERROR_DIRECTORY_NOT_SUPPORTED
            return std::error_code(ERROR_DIRECTORY_NOT_SUPPORTED, std::system_category());
#else
            return std::error_code(ERROR_NOT_SUPPORTED, std::system_category());
#endif
    }
#else
    switch (err) {
        case portable_error::none:
            return std::error_code();
        case portable_error::exists:
            return std::error_code(EEXIST, std::system_category());
        case portable_error::not_found:
            return std::error_code(ENOENT, std::system_category());
        case portable_error::not_supported:
            return std::error_code(ENOTSUP, std::system_category());
        case portable_error::not_implemented:
            return std::error_code(ENOSYS, std::system_category());
        case portable_error::invalid_argument:
            return std::error_code(EINVAL, std::system_category());
        case portable_error::is_a_directory:
            return std::error_code(EISDIR, std::system_category());
    }
#endif
    return std::error_code();
}